

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::mutate(wasm::Function*)::Modder::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  Block *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  Index IVar4;
  Expression *pEVar5;
  Block *item;
  Drop *pDVar6;
  Expression **ppEVar7;
  ulong in_RCX;
  Type type;
  TranslateToFuzzReader *pTVar8;
  Builder *this_00;
  ExpressionList *this_01;
  AbstractChildIterator<wasm::ChildIterator> *pAVar9;
  Iterator IVar10;
  optional<wasm::Type> type_00;
  Literal local_a8;
  undefined1 local_90 [8];
  ChildIterator children;
  Iterator local_48;
  Block *local_38;
  
  uVar3 = Random::upTo((Random *)(*(long *)((long)this + 0xd8) + 0x18),100);
  if (*(uint *)((long)this + 0xe0) <= uVar3) {
    return;
  }
  bVar2 = canBeArbitrarilyReplaced(*(TranslateToFuzzReader **)((long)this + 0xd8),curr);
  if (!bVar2) {
    return;
  }
  uVar3 = Random::upTo((Random *)(*(long *)((long)this + 0xd8) + 0x18),100);
  if (((int)uVar3 < 5) && (*(char *)((long)this + 0xe4) != '\0')) {
    pTVar8 = *(TranslateToFuzzReader **)((long)this + 0xd8);
    type.id = 1;
  }
  else {
    if (curr->_id != ConstId) {
      item = (Block *)make(*(TranslateToFuzzReader **)((long)this + 0xd8),(Type)(curr->type).id);
      if ((int)uVar3 < 0x21) {
        if (((item->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id != 0
            ) && (((uVar3 & 1) == 0 || (bVar2 = replaceChildWith((Expression *)item,curr), !bVar2)))
           ) {
          this_00 = (Builder *)(*(long *)((long)this + 0xd8) + 0x10);
          pDVar6 = Builder::makeDrop(this_00,curr);
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
          item = Builder::makeSequence(this_00,(Expression *)pDVar6,(Expression *)item,type_00);
        }
      }
      else if ((0x41 < uVar3) &&
              ((0x35 < (ulong)curr->_id ||
               ((0x3000000000000eU >> ((ulong)curr->_id & 0x3f) & 1) == 0)))) {
        AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                  ((AbstractChildIterator<wasm::ChildIterator> *)local_90,curr);
        if (((int)((ulong)((long)children.super_AbstractChildIterator<wasm::ChildIterator>.children.
                                 flexible.
                                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                          (long)children.super_AbstractChildIterator<wasm::ChildIterator>.children.
                                fixed._M_elems[3]) >> 3) + local_90._0_4_) - 1U < 4) {
          local_38 = MixedArena::alloc<wasm::Block>
                               ((MixedArena *)
                                (*(long *)(*(long *)((long)this + 0xd8) + 0x10) + 0x200));
          local_48.index = 0;
          local_48.parent = (AbstractChildIterator<wasm::ChildIterator> *)local_90;
          IVar10 = AbstractChildIterator<wasm::ChildIterator>::end
                             ((AbstractChildIterator<wasm::ChildIterator> *)local_90);
          children.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)IVar10.parent;
          this_01 = &local_38->list;
          IVar4 = 0;
          pAVar9 = (AbstractChildIterator<wasm::ChildIterator> *)local_90;
          while ((pBVar1 = local_38, IVar4 != IVar10.index ||
                 (pAVar9 != (AbstractChildIterator<wasm::ChildIterator> *)
                            children.super_AbstractChildIterator<wasm::ChildIterator>.children.
                            flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage))) {
            ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_48);
            pEVar5 = *ppEVar7;
            bVar2 = replaceChildWith((Expression *)item,pEVar5);
            if (!bVar2) {
              pDVar6 = Builder::makeDrop((Builder *)(*(long *)((long)this + 0xd8) + 0x10),pEVar5);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (&this_01->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(Expression *)pDVar6);
            }
            IVar4 = local_48.index + 1;
            pAVar9 = local_48.parent;
            local_48.index = IVar4;
          }
          if ((local_38->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements != 0) {
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (&this_01->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       (Expression *)item);
            wasm::Block::finalize(pBVar1);
            item = pBVar1;
          }
        }
        std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                   (children.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                    _M_elems + 3));
      }
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::replaceCurrent
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)this,
                 (Expression *)item);
      return;
    }
    if ((int)uVar3 < 0x32) {
      pTVar8 = *(TranslateToFuzzReader **)((long)this + 0xd8);
      wasm::Literal::Literal(&local_a8,(Literal *)(curr + 1));
      tweak((Literal *)local_90,pTVar8,&local_a8);
      wasm::Literal::operator=((Literal *)(curr + 1),(Literal *)local_90);
      wasm::Literal::~Literal((Literal *)local_90);
      wasm::Literal::~Literal(&local_a8);
      return;
    }
    pTVar8 = *(TranslateToFuzzReader **)((long)this + 0xd8);
    type.id = (curr->type).id;
  }
  pEVar5 = make(pTVar8,type);
  Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::replaceCurrent
            ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)this,pEVar5);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.upTo(100) < percentChance &&
          parent.canBeArbitrarilyReplaced(curr)) {
        // We can replace in various modes, see below. Generate a random number
        // up to 100 to help us there.
        int mode = parent.upTo(100);

        if (allowUnreachable && mode < 5) {
          replaceCurrent(parent.make(Type::unreachable));
          return;
        }

        // For constants, perform only a small tweaking in some cases.
        // TODO: more minor tweaks to immediates, like making a load atomic or
        // not, changing an offset, etc.
        if (auto* c = curr->dynCast<Const>()) {
          if (mode < 50) {
            c->value = parent.tweak(c->value);
          } else {
            // Just replace the entire thing.
            replaceCurrent(parent.make(curr->type));
          }
          return;
        }

        // Generate a replacement for the expression, and by default replace all
        // of |curr| (including children) with that replacement, but in some
        // cases we can do more subtle things.
        //
        // Note that such a replacement is not always valid due to nesting of
        // labels, but we'll fix that up later. Note also that make() picks a
        // subtype, so this has a chance to replace us with anything that is
        // valid to put here.
        auto* rep = parent.make(curr->type);
        if (mode < 33 && rep->type != Type::none) {
          // This has a non-none type. Replace the output, keeping the
          // expression and its children in a drop. This "interposes" between
          // this expression and its parent, something like this:
          //
          //    (D
          //      (A
          //        (B)
          //        (C)
          //      )
          //    )
          ////
          //    => ;; keep A, replace it in the parent
          //
          //    (D
          //      (block
          //        (drop
          //          (A
          //            (B)
          //            (C)
          //          )
          //        )
          //        (NEW)
          //      )
          //    )
          //
          // We also sometimes try to insert A as a child of NEW, so we actually
          // interpose directly:
          //
          //    (D
          //      (NEW
          //        (A
          //          (B)
          //          (C)
          //        )
          //      )
          //    )
          //
          // We do not do that all the time, as inserting a drop is actually an
          // important situation to test: the drop makes the output of A unused,
          // which may let optimizations remove it.
          if ((mode & 1) && replaceChildWith(rep, curr)) {
            // We managed to replace one of the children with curr, and have
            // nothing more to do.
          } else {
            // Drop curr and append.
            rep =
              parent.builder.makeSequence(parent.builder.makeDrop(curr), rep);
          }
        } else if (mode >= 66 && !Properties::isControlFlowStructure(curr)) {
          ChildIterator children(curr);
          auto numChildren = children.getNumChildren();
          if (numChildren > 0 && numChildren < 5) {
            // This is a normal (non-control-flow) expression with at least one
            // child (and not an excessive amount of them; see the processing
            // below). "Interpose" between the children and this expression by
            // keeping them and replacing the parent |curr|. We do this by
            // generating drops of the children, like this:
            //
            //  (A
            //    (B)
            //    (C)
            //  )
            //
            //  => ;; keep children, replace A
            //
            //  (block
            //    (drop (B))
            //    (drop (C))
            //    (NEW)
            //  )
            //
            auto* block = parent.builder.makeBlock();
            for (auto* child : children) {
              // Only drop the child if we can't replace it as one of NEW's
              // children. This does a linear scan of |rep| which is the reason
              // for the above limit on the number of children.
              if (!replaceChildWith(rep, child)) {
                block->list.push_back(parent.builder.makeDrop(child));
              }
            }

            if (!block->list.empty()) {
              // We need the block, that is, we did not find a place for all the
              // children.
              block->list.push_back(rep);
              block->finalize();
              rep = block;
            }
          }
        }
        replaceCurrent(rep);
      }
    }